

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__fancy_alpha_unweight_4ch(float *encode_buffer,int width_times_channels)

{
  float fVar1;
  undefined8 uVar2;
  float fVar3;
  __m128 ia;
  __m128 i;
  float alpha;
  float *end_output;
  float *input;
  float *encode;
  int width_times_channels_local;
  float *encode_buffer_local;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  end_output = encode_buffer;
  input = encode_buffer;
  do {
    fVar1 = end_output[3];
    if (7.523164e-37 <= fVar1) {
      fVar3 = 1.0 / fVar1;
      local_48 = (float)*(undefined8 *)(end_output + 4);
      fStack_44 = (float)((ulong)*(undefined8 *)(end_output + 4) >> 0x20);
      fStack_40 = (float)*(undefined8 *)(end_output + 6);
      fStack_3c = (float)((ulong)*(undefined8 *)(end_output + 6) >> 0x20);
      ia[3] = fStack_44 * fVar3;
      ia[2] = local_48 * fVar3;
      i[1] = fStack_3c * fVar3;
      i[0] = fStack_40 * fVar3;
      *(undefined8 *)input = ia._8_8_;
      *(undefined8 *)(input + 2) = i._0_8_;
      input[3] = fVar1;
    }
    else {
      uVar2 = *(undefined8 *)(end_output + 2);
      *(undefined8 *)input = *(undefined8 *)end_output;
      *(undefined8 *)(input + 2) = uVar2;
    }
    end_output = end_output + 7;
    input = input + 4;
  } while (input < encode_buffer + width_times_channels);
  return;
}

Assistant:

static void stbir__fancy_alpha_unweight_4ch( float * encode_buffer, int width_times_channels )
{
  float STBIR_SIMD_STREAMOUT_PTR(*) encode = encode_buffer;
  float STBIR_SIMD_STREAMOUT_PTR(*) input = encode_buffer;
  float const * end_output = encode_buffer + width_times_channels;

  // fancy RGBA is stored internally as R G B A Rpm Gpm Bpm

  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float alpha = input[3];
#ifdef STBIR_SIMD
    stbir__simdf i,ia;
    STBIR_SIMD_NO_UNROLL(encode);
    if ( alpha < stbir__small_float )
    {
      stbir__simdf_load( i, input );
      stbir__simdf_store( encode, i );
    }
    else
    {
      stbir__simdf_load1frep4( ia, 1.0f / alpha );
      stbir__simdf_load( i, input+4 );
      stbir__simdf_mult( i, i, ia );
      stbir__simdf_store( encode, i );
      encode[3] = alpha;
    }
#else
    if ( alpha < stbir__small_float )
    {
      encode[0] = input[0];
      encode[1] = input[1];
      encode[2] = input[2];
    }
    else
    {
      float ialpha = 1.0f / alpha;
      encode[0] = input[4] * ialpha;
      encode[1] = input[5] * ialpha;
      encode[2] = input[6] * ialpha;
    }
    encode[3] = alpha;
#endif

    input += 7;
    encode += 4;
  } while ( encode < end_output );
}